

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

void __thiscall kj::TaskSet::~TaskSet(TaskSet *this)

{
  PromiseFulfiller<void> *pPVar1;
  Disposer *pDVar2;
  Task *pTVar3;
  
  pPVar1 = (this->emptyFulfiller).ptr.ptr;
  if (pPVar1 != (PromiseFulfiller<void> *)0x0) {
    (this->emptyFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
    pDVar2 = (this->emptyFulfiller).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,pPVar1->_vptr_PromiseFulfiller[-2] + (long)&pPVar1->_vptr_PromiseFulfiller);
  }
  pTVar3 = (this->tasks).ptr.ptr;
  if (pTVar3 != (Task *)0x0) {
    (this->tasks).ptr.ptr = (Task *)0x0;
    pDVar2 = (this->tasks).ptr.disposer;
    (**pDVar2->_vptr_Disposer)
              (pDVar2,(_func_int *)
                      ((long)&(pTVar3->super_Event)._vptr_Event +
                      (long)(pTVar3->super_Event)._vptr_Event[-2]));
    return;
  }
  return;
}

Assistant:

TaskSet::~TaskSet() noexcept(false) {}